

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hpdf_encoder.c
# Opt level: O1

HPDF_STATUS HPDF_CMapEncoder_AddCMap(HPDF_Encoder encoder,HPDF_CidRange_Rec *range)

{
  ushort uVar1;
  void *pvVar2;
  bool bVar3;
  HPDF_UINT16 code;
  uint uVar4;
  HPDF_UINT16 *item;
  HPDF_STATUS HVar5;
  HPDF_UINT16 HVar6;
  HPDF_STATUS local_40;
  
  pvVar2 = encoder->attr;
  do {
    uVar1 = range->from;
    uVar4 = (uint)uVar1;
    if ((uVar1 == 0xffff) && (range->to == 0xffff)) {
      return 0;
    }
    if ((encoder->to_unicode_fn == HPDF_CMapEncoder_ToUnicode) && (uVar1 <= range->to)) {
      HVar6 = range->cid;
      do {
        *(HPDF_UINT16 *)
         ((long)pvVar2 + (ulong)(uVar4 >> 8 & 0xff) * 2 + (ulong)((uVar4 & 0xff) << 9) + 0x20000) =
             HVar6;
        uVar4 = uVar4 + 1;
        HVar6 = HVar6 + 1;
      } while ((ushort)uVar4 <= range->to);
    }
    item = (HPDF_UINT16 *)HPDF_GetMem(encoder->mmgr,6);
    if (item == (HPDF_UINT16 *)0x0) {
      local_40 = encoder->error->error_no;
      bVar3 = false;
    }
    else {
      *item = range->from;
      item[1] = range->to;
      item[2] = range->cid;
      HVar5 = HPDF_List_Add(*(HPDF_List *)((long)pvVar2 + 0x40100),item);
      if (HVar5 == 0) {
        range = range + 1;
        bVar3 = true;
      }
      else {
        HPDF_FreeMem(encoder->mmgr,item);
        bVar3 = false;
        local_40 = HVar5;
      }
    }
  } while (bVar3);
  return local_40;
}

Assistant:

HPDF_STATUS
HPDF_CMapEncoder_AddCMap  (HPDF_Encoder             encoder,
                           const HPDF_CidRange_Rec  *range)
{
    HPDF_CMapEncoderAttr attr = (HPDF_CMapEncoderAttr)encoder->attr;

    HPDF_PTRACE ((" HPDF_CMapEncoder_AddCMap\n"));

    /* Copy specified pdf_cid_range array to fRangeArray. */
    while (range->from != 0xffff || range->to != 0xffff) {
        HPDF_CidRange_Rec *prange;
        HPDF_STATUS ret;

        /*
         * Only if we have the default to_unicode_fn
         */
        if (encoder->to_unicode_fn == HPDF_CMapEncoder_ToUnicode) {
            HPDF_UINT16 code = range->from;
            HPDF_UINT16 cid = range->cid;

            while (code <= range->to) {
                HPDF_BYTE l = (HPDF_BYTE)code;
                HPDF_BYTE h = code >> 8;

                attr->cid_map[l][h] = cid;
                code++;
                cid++;
            }
        }

        prange = HPDF_GetMem (encoder->mmgr, sizeof(HPDF_CidRange_Rec));
        if (!prange)
            return encoder->error->error_no;

        prange->from = range->from;
        prange->to = range->to;
        prange->cid = range->cid;

        if ((ret = HPDF_List_Add (attr->cmap_range, prange)) != HPDF_OK) {
            HPDF_FreeMem (encoder->mmgr, prange);
            return ret;
        }

        range++;
    }

    return HPDF_OK;
}